

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcaf_grammar_char(mpc_val_t *x,void *s)

{
  char *__ptr;
  mpc_parser_t *pmVar1;
  mpc_parser_t *local_38;
  mpc_parser_t *p;
  char *y;
  mpca_grammar_st_t *st;
  void *s_local;
  mpc_val_t *x_local;
  
  __ptr = (char *)mpcf_unescape(x);
  if ((*(uint *)((long)s + 0x18) & 2) == 0) {
    pmVar1 = mpc_char(*__ptr);
    local_38 = mpc_tok(pmVar1);
  }
  else {
    local_38 = mpc_char(*__ptr);
  }
  free(__ptr);
  pmVar1 = mpc_apply(local_38,mpcf_str_ast);
  pmVar1 = mpca_tag(pmVar1,"char");
  pmVar1 = mpca_state(pmVar1);
  return pmVar1;
}

Assistant:

static mpc_val_t *mpcaf_grammar_char(mpc_val_t *x, void *s) {
  mpca_grammar_st_t *st = s;
  char *y = mpcf_unescape(x);
  mpc_parser_t *p = (st->flags & MPCA_LANG_WHITESPACE_SENSITIVE) ? mpc_char(y[0]) : mpc_tok(mpc_char(y[0]));
  free(y);
  return mpca_state(mpca_tag(mpc_apply(p, mpcf_str_ast), "char"));
}